

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O1

string * just::environment::impl::append_to_path
                   (string *__return_storage_ptr__,string *item_,string *path_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  size_type sVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  string *__lhs;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s2 = &local_68.field_2;
  local_68.field_2._M_local_buf[0] = ':';
  local_68.field_2._M_local_buf[1] = '\0';
  local_68._M_string_length = 1;
  sVar1 = path_->_M_string_length;
  local_68._M_dataplus._M_p = (pointer)__s2;
  if ((sVar1 == 0) || ((sVar1 == 1 && (iVar3 = bcmp((path_->_M_dataplus)._M_p,__s2,1), iVar3 == 0)))
     ) {
    std::operator+(__return_storage_ptr__,item_,path_);
  }
  else {
    __lhs = &local_68;
    if ((sVar1 != 0) &&
       (__lhs = &local_68, (path_->_M_dataplus)._M_p[sVar1 - 1] == local_68.field_2._M_local_buf[0])
       ) {
      __lhs = item_;
      item_ = &local_68;
    }
    std::operator+(&local_48,__lhs,item_);
    plVar4 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_48,0,(char *)0x0,(ulong)(path_->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != __s2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT62(local_68.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_68.field_2._M_local_buf[1],
                                      local_68.field_2._M_local_buf[0])) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string append_to_path(
        const std::string& item_,
        const std::string& path_
      )
      {
        const std::string sep = path_separator();

        if (path_.empty() || path_ == sep)
        {
          return item_ + path_;
        }
        else
        {
          return path_ + (ends_with(path_, sep) ? item_ + sep : sep + item_);
        }
      }